

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_test.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  UnitTest *this;
  int local_1c;
  
  local_1c = argc;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nExecuting test...",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
  std::ostream::put('\0');
  std::ostream::flush();
  testing::InitGoogleTest(&local_1c,argv);
  this = testing::UnitTest::GetInstance();
  iVar1 = testing::UnitTest::Run(this);
  return iVar1;
}

Assistant:

int main(int argc, char *argv[])
{
	std::cout << "\nExecuting test..." << std::endl;

	::testing::InitGoogleTest(&argc, argv);
	return RUN_ALL_TESTS();
}